

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

CPscl cp_decl_spec(CPState *cp,CPDecl *decl,CPscl scl)

{
  int iVar1;
  uint uVar2;
  uint local_30;
  CTInfo info;
  uint32_t cbit;
  CTypeID tdef;
  uint32_t sz;
  uint32_t cds;
  CPscl scl_local;
  CPDecl *decl_local;
  CPState *cp_local;
  
  tdef = 0;
  cbit = 0;
  info = 0;
  decl->cp = cp;
  decl->mode = cp->mode;
  decl->name = (GCstr *)0x0;
  decl->redir = (GCstr *)0x0;
  decl->attr = 0;
  decl->fattr = 0;
  decl->top = 0;
  decl->pos = 0;
  decl->stack[0].next = 0;
  do {
    while ((cp_decl_attributes(cp,decl), cp->tok < 0x10d || (0x120 < cp->tok))) {
      if ((cbit != 0) || ((info != 0 || ((tdef & 0x7a0) != 0)))) goto LAB_0019bb6f;
      iVar1 = cp->tok;
      if (iVar1 == 0x24) {
        info = (cp->val).id;
        cp_next(cp);
      }
      else if (iVar1 == 0x100) {
        if (cp->ct->info >> 0x1c != 7) goto LAB_0019bb6f;
        info = cp->ct->info & 0xffff;
        cp_next(cp);
      }
      else if (iVar1 == 0x127) {
        info = cp_decl_struct(cp,decl,0x10000000);
      }
      else if (iVar1 == 0x128) {
        info = cp_decl_struct(cp,decl,0x10800000);
      }
      else {
        if (iVar1 != 0x129) goto LAB_0019bb6f;
        info = cp_decl_enum(cp,decl);
      }
    }
    if (cp->ct->size != 0) {
      if (cbit != 0) {
LAB_0019bb6f:
        if (((tdef & 0x100) != 0) && (info = 0x10, cbit == 4)) {
          info = 0xf;
        }
        if (info == 0) {
          if ((tdef & 1) == 0) {
            local_30 = 0;
            if ((tdef & 0x400) != 0) {
              local_30 = 0x800000;
            }
            if ((tdef & 2) == 0) {
              if ((tdef & 0x10) == 0) {
                if ((tdef & 4) == 0) {
                  if ((tdef & 0x80) == 0) {
                    if ((tdef & 0x40) == 0) {
                      if ((tdef & 0x20) == 0) {
                        if (cbit == 0) {
                          if ((tdef & 0x600) == 0) {
                            cp_errmsg(cp,cp->tok,LJ_ERR_FFI_DECLSPEC);
                          }
                          cbit = 4;
                        }
                      }
                      else {
                        local_30 = local_30 | 0x400000;
                        cbit = 8;
                      }
                    }
                    else {
                      cbit = 8;
                    }
                  }
                  else {
                    cbit = 2;
                  }
                }
              }
              else {
                local_30 = 0x4000000;
                if ((tdef & 0x20) != 0) {
                  cbit = 0x10;
                }
              }
            }
            else {
              if ((tdef & 0xfff079f5) != 0) {
                cp_errmsg(cp,0,LJ_ERR_FFI_INVTYPE);
              }
              local_30 = local_30 | 0x8000000;
              if ((tdef & 0x200) == 0) {
                local_30 = 0x8800000;
              }
              if (cbit == 0) {
                cbit = 1;
              }
            }
            iVar1 = 0x1f;
            if (cbit != 0) {
              for (; cbit >> iVar1 == 0; iVar1 = iVar1 + -1) {
              }
            }
            cp_push(decl,(decl->attr & 0x3000000) + iVar1 * 0x10000 + local_30,cbit);
            decl->attr = decl->attr & 0xfcffffff;
          }
          else {
            cp_push(decl,(decl->attr & 0x3000000) + 0x40000000,0xffffffff);
            decl->attr = decl->attr & 0xfcffffff;
          }
        }
        else {
          cp_push_type(decl,info);
        }
        decl->specpos = decl->pos;
        decl->specattr = decl->attr;
        decl->specfattr = decl->fattr;
        return tdef & 0xf8000;
      }
      cbit = cp->ct->size;
    }
    uVar2 = 1 << ((char)cp->tok - 0xdU & 0x1f);
    tdef = tdef | uVar2 | (uVar2 & tdef & 0x20) << 1;
    if (cp->tok < 0x11c) {
      if (info != 0) goto LAB_0019bb6f;
    }
    else if ((scl & uVar2) == 0) {
      cp_errmsg(cp,cp->tok,LJ_ERR_FFI_BADSCL);
    }
    cp_next(cp);
  } while( true );
}

Assistant:

static CPscl cp_decl_spec(CPState *cp, CPDecl *decl, CPscl scl)
{
  uint32_t cds = 0, sz = 0;
  CTypeID tdef = 0;

  decl->cp = cp;
  decl->mode = cp->mode;
  decl->name = NULL;
  decl->redir = NULL;
  decl->attr = 0;
  decl->fattr = 0;
  decl->pos = decl->top = 0;
  decl->stack[0].next = 0;

  for (;;) {  /* Parse basic types. */
    cp_decl_attributes(cp, decl);
    if (cp->tok >= CTOK_FIRSTDECL && cp->tok <= CTOK_LASTDECLFLAG) {
      uint32_t cbit;
      if (cp->ct->size) {
	if (sz) goto end_decl;
	sz = cp->ct->size;
      }
      cbit = (1u << (cp->tok - CTOK_FIRSTDECL));
      cds = cds | cbit | ((cbit & cds & CDF_LONG) << 1);
      if (cp->tok >= CTOK_FIRSTSCL) {
	if (!(scl & cbit)) cp_errmsg(cp, cp->tok, LJ_ERR_FFI_BADSCL);
      } else if (tdef) {
	goto end_decl;
      }
      cp_next(cp);
      continue;
    }
    if (sz || tdef ||
	(cds & (CDF_SHORT|CDF_LONG|CDF_SIGNED|CDF_UNSIGNED|CDF_COMPLEX)))
      break;
    switch (cp->tok) {
    case CTOK_STRUCT:
      tdef = cp_decl_struct(cp, decl, CTINFO(CT_STRUCT, 0));
      continue;
    case CTOK_UNION:
      tdef = cp_decl_struct(cp, decl, CTINFO(CT_STRUCT, CTF_UNION));
      continue;
    case CTOK_ENUM:
      tdef = cp_decl_enum(cp, decl);
      continue;
    case CTOK_IDENT:
      if (ctype_istypedef(cp->ct->info)) {
	tdef = ctype_cid(cp->ct->info);  /* Get typedef. */
	cp_next(cp);
	continue;
      }
      break;
    case '$':
      tdef = cp->val.id;
      cp_next(cp);
      continue;
    default:
      break;
    }
    break;
  }
end_decl:

  if ((cds & CDF_COMPLEX))  /* Use predefined complex types. */
    tdef = sz == 4 ? CTID_COMPLEX_FLOAT : CTID_COMPLEX_DOUBLE;

  if (tdef) {
    cp_push_type(decl, tdef);
  } else if ((cds & CDF_VOID)) {
    cp_push(decl, CTINFO(CT_VOID, (decl->attr & CTF_QUAL)), CTSIZE_INVALID);
    decl->attr &= ~CTF_QUAL;
  } else {
    /* Determine type info and size. */
    CTInfo info = CTINFO(CT_NUM, (cds & CDF_UNSIGNED) ? CTF_UNSIGNED : 0);
    if ((cds & CDF_BOOL)) {
      if ((cds & ~(CDF_SCL|CDF_BOOL|CDF_INT|CDF_SIGNED|CDF_UNSIGNED)))
	cp_errmsg(cp, 0, LJ_ERR_FFI_INVTYPE);
      info |= CTF_BOOL;
      if (!(cds & CDF_SIGNED)) info |= CTF_UNSIGNED;
      if (!sz) {
	sz = 1;
      }
    } else if ((cds & CDF_FP)) {
      info = CTINFO(CT_NUM, CTF_FP);
      if ((cds & CDF_LONG)) sz = sizeof(long double);
    } else if ((cds & CDF_CHAR)) {
      if ((cds & (CDF_CHAR|CDF_SIGNED|CDF_UNSIGNED)) == CDF_CHAR)
	info |= CTF_UCHAR;  /* Handle platforms where char is unsigned. */
    } else if ((cds & CDF_SHORT)) {
      sz = sizeof(short);
    } else if ((cds & CDF_LONGLONG)) {
      sz = 8;
    } else if ((cds & CDF_LONG)) {
      info |= CTF_LONG;
      sz = sizeof(long);
    } else if (!sz) {
      if (!(cds & (CDF_SIGNED|CDF_UNSIGNED)))
	cp_errmsg(cp, cp->tok, LJ_ERR_FFI_DECLSPEC);
      sz = sizeof(int);
    }
    lj_assertCP(sz != 0, "basic ctype with zero size");
    info += CTALIGN(lj_fls(sz));  /* Use natural alignment. */
    info += (decl->attr & CTF_QUAL);  /* Merge qualifiers. */
    cp_push(decl, info, sz);
    decl->attr &= ~CTF_QUAL;
  }
  decl->specpos = decl->pos;
  decl->specattr = decl->attr;
  decl->specfattr = decl->fattr;
  return (cds & CDF_SCL);  /* Return storage class. */
}